

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O1

bool __thiscall
QPageLayout::setMargins(QPageLayout *this,QMarginsF *margins,OutOfBoundsPolicy outOfBoundsPolicy)

{
  QPageLayoutPrivate *pQVar1;
  qreal qVar2;
  qreal qVar3;
  qreal qVar4;
  bool bVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QMarginsF local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (pQVar1->m_mode != FullPageMode) {
    if (outOfBoundsPolicy == Clamp) {
      local_58.m_right._0_4_ = 0xffffffff;
      local_58.m_right._4_4_ = 0xffffffff;
      local_58.m_bottom._0_4_ = 0xffffffff;
      local_58.m_bottom._4_4_ = 0xffffffff;
      local_58.m_left._0_4_ = 0xffffffff;
      local_58.m_left._4_4_ = 0xffffffff;
      local_58.m_top._0_4_ = 0xffffffff;
      local_58.m_top._4_4_ = 0xffffffff;
      QPageLayoutPrivate::clampMargins(pQVar1,margins);
      bVar6 = qFuzzyCompare(&local_58,&pQVar1->m_margins);
      if (!bVar6) {
        pQVar1 = (this->d).d.ptr;
        if ((pQVar1 != (QPageLayoutPrivate *)0x0) &&
           ((__atomic_base<int>)
            *(__int_type *)
             &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value != (__atomic_base<int>)0x1)) {
          QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach_helper(&this->d);
        }
        pQVar1 = (this->d).d.ptr;
        (pQVar1->m_margins).m_right = (qreal)CONCAT44(local_58.m_right._4_4_,local_58.m_right._0_4_)
        ;
        (pQVar1->m_margins).m_bottom =
             (qreal)CONCAT44(local_58.m_bottom._4_4_,local_58.m_bottom._0_4_);
        (pQVar1->m_margins).m_left = (qreal)CONCAT44(local_58.m_left._4_4_,local_58.m_left._0_4_);
        (pQVar1->m_margins).m_top = (qreal)CONCAT44(local_58.m_top._4_4_,local_58.m_top._0_4_);
      }
      bVar6 = true;
      goto LAB_003af9eb;
    }
    if (((((margins->m_left < (pQVar1->m_minMargins).m_left) ||
          (margins->m_right < (pQVar1->m_minMargins).m_right)) ||
         (margins->m_top < (pQVar1->m_minMargins).m_top)) ||
        ((margins->m_bottom < (pQVar1->m_minMargins).m_bottom ||
         ((pQVar1->m_maxMargins).m_left < margins->m_left)))) ||
       (((pQVar1->m_maxMargins).m_right < margins->m_right ||
        (((pQVar1->m_maxMargins).m_top < margins->m_top ||
         ((pQVar1->m_maxMargins).m_bottom < margins->m_bottom)))))) {
      bVar6 = false;
      goto LAB_003af9eb;
    }
  }
  bVar5 = qFuzzyCompare(margins,&pQVar1->m_margins);
  bVar6 = true;
  if (!bVar5) {
    pQVar1 = (this->d).d.ptr;
    if ((pQVar1 != (QPageLayoutPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QExplicitlySharedDataPointer<QPageLayoutPrivate>::detach_helper(&this->d);
    }
    pQVar1 = (this->d).d.ptr;
    qVar2 = margins->m_left;
    qVar3 = margins->m_top;
    qVar4 = margins->m_bottom;
    (pQVar1->m_margins).m_right = margins->m_right;
    (pQVar1->m_margins).m_bottom = qVar4;
    (pQVar1->m_margins).m_left = qVar2;
    (pQVar1->m_margins).m_top = qVar3;
  }
LAB_003af9eb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QPageLayout::setMargins(const QMarginsF &margins, OutOfBoundsPolicy outOfBoundsPolicy)
{
    if (d->m_mode == FullPageMode) {
        if (margins != d->m_margins) {
            d.detach();
            d->m_margins = margins;
        }
        return true;
    }

    if (outOfBoundsPolicy == OutOfBoundsPolicy::Clamp) {
        const QMarginsF clampedMargins = d->clampMargins(margins);
        if (clampedMargins != d->m_margins) {
            d.detach();
            d->m_margins = clampedMargins;
        }
        return true;
    }

    if (margins.left() >= d->m_minMargins.left()
        && margins.right() >= d->m_minMargins.right()
        && margins.top() >= d->m_minMargins.top()
        && margins.bottom() >= d->m_minMargins.bottom()
        && margins.left() <= d->m_maxMargins.left()
        && margins.right() <= d->m_maxMargins.right()
        && margins.top() <= d->m_maxMargins.top()
        && margins.bottom() <= d->m_maxMargins.bottom()) {
        if (margins != d->m_margins) {
            d.detach();
            d->m_margins = margins;
        }
        return true;
    }

    return false;
}